

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  pointer pfVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  void *pvVar27;
  void *pvVar28;
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  int remain;
  
  auVar14 = _DAT_0016d030;
  auVar13 = _DAT_0016d020;
  auVar12 = _DAT_0016d010;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    iVar5 = bottom_blob->w;
    pvVar6 = top_blob->data;
    lVar24 = top_blob->cstep * top_blob->elemsize;
    uVar15 = iVar4 * iVar3;
    pfVar7 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar8 = bottom_blob->data;
    sVar9 = bottom_blob->cstep;
    sVar10 = bottom_blob->elemsize;
    lVar16 = (ulong)uVar15 - 1;
    auVar29._8_4_ = (int)lVar16;
    auVar29._0_8_ = lVar16;
    auVar29._12_4_ = (int)((ulong)lVar16 >> 0x20);
    lVar16 = (long)pvVar6 + 0xc;
    lVar22 = 0;
    auVar29 = auVar29 ^ _DAT_0016d030;
    do {
      if (_bias == (Mat *)0x0) {
        uVar30 = 0;
      }
      else {
        uVar30 = *(undefined4 *)((long)&_bias->data + lVar22 * 4);
      }
      fVar1 = pfVar7[lVar22];
      if (0 < (int)uVar15) {
        uVar17 = 0;
        do {
          auVar31._8_4_ = (int)uVar17;
          auVar31._0_8_ = uVar17;
          auVar31._12_4_ = (int)(uVar17 >> 0x20);
          auVar32 = (auVar31 | auVar13) ^ auVar14;
          iVar21 = auVar29._4_4_;
          if ((bool)(~(iVar21 < auVar32._4_4_ ||
                      auVar29._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar21) & 1)) {
            *(undefined4 *)(lVar16 + -0xc + uVar17 * 4) = uVar30;
          }
          if (auVar32._12_4_ <= auVar29._12_4_ &&
              (auVar32._8_4_ <= auVar29._8_4_ || auVar32._12_4_ != auVar29._12_4_)) {
            *(undefined4 *)(lVar16 + -8 + uVar17 * 4) = uVar30;
          }
          auVar31 = (auVar31 | auVar12) ^ auVar14;
          iVar33 = auVar31._4_4_;
          if (iVar33 <= iVar21 && (iVar33 != iVar21 || auVar31._0_4_ <= auVar29._0_4_)) {
            *(undefined4 *)(lVar16 + -4 + uVar17 * 4) = uVar30;
            *(undefined4 *)(lVar16 + uVar17 * 4) = uVar30;
          }
          uVar17 = uVar17 + 4;
        } while ((uVar15 + 3 & 0xfffffffc) != uVar17);
      }
      if (0 < iVar4) {
        pvVar28 = (void *)(lVar24 * lVar22 + (long)pvVar6);
        lVar11 = lVar22 * 9;
        pvVar27 = (void *)(sVar9 * sVar10 * lVar22 + (long)pvVar8);
        pvVar23 = (void *)((long)iVar5 * 2 + (long)pvVar27);
        lVar18 = (long)iVar5 + (long)pvVar27;
        iVar21 = 0;
        do {
          if (0 < iVar3) {
            lVar26 = 2;
            lVar25 = 0;
            lVar19 = 0;
            uVar20 = iVar3 + 1;
            do {
              *(float *)((long)pvVar28 + lVar26 * 4 + -8) =
                   (float)((int)*(char *)((long)&_kernel->refcount + lVar11) *
                           (int)*(char *)((long)pvVar23 + lVar26) +
                           (int)*(char *)((long)&_kernel->data + lVar11 + 7) *
                           (int)*(char *)((long)pvVar23 + lVar26 + -1) +
                          (int)*(char *)((long)&_kernel->data + lVar11 + 6) *
                          (int)*(char *)((long)pvVar23 + lVar26 + -2) +
                          (int)*(char *)((long)&_kernel->data + lVar11 + 5) *
                          (int)*(char *)(lVar18 + lVar26) +
                          (int)*(char *)((long)&_kernel->data + lVar11 + 4) *
                          (int)*(char *)(lVar18 + -1 + lVar26) +
                          (int)*(char *)((long)&_kernel->data + lVar11 + 3) *
                          (int)*(char *)(lVar18 + -2 + lVar26) +
                          (int)*(char *)((long)&_kernel->data + lVar11 + 2) *
                          (int)*(char *)((long)pvVar27 + lVar26) +
                          (int)*(char *)((long)&_kernel->data + lVar11 + 1) *
                          (int)*(char *)((long)pvVar27 + lVar26 + -1) +
                          (int)*(char *)((long)&_kernel->data + lVar11) *
                          (int)*(char *)((long)pvVar27 + lVar26 + -2)) * fVar1 +
                   *(float *)((long)pvVar28 + lVar26 * 4 + -8);
              uVar20 = uVar20 - 1;
              lVar19 = lVar19 + -1;
              lVar26 = lVar26 + 1;
              lVar25 = lVar25 + -4;
            } while (1 < uVar20);
            pvVar23 = (void *)((long)pvVar23 - lVar19);
            lVar18 = lVar18 - lVar19;
            pvVar27 = (void *)((long)pvVar27 - lVar19);
            pvVar28 = (void *)((long)pvVar28 - lVar25);
          }
          pvVar27 = (void *)((long)pvVar27 + 2);
          lVar18 = lVar18 + 2;
          pvVar23 = (void *)((long)pvVar23 + 2);
          iVar21 = iVar21 + 1;
        } while (iVar21 != iVar4);
      }
      lVar22 = lVar22 + 1;
      lVar16 = lVar16 + lVar24;
    } while (lVar22 != iVar2);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];    

        out.fill(bias0);    

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}